

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

void __thiscall TArray<FName,_FName>::DoCopy(TArray<FName,_FName> *this,TArray<FName,_FName> *other)

{
  uint uVar1;
  FName *pFVar2;
  uint local_1c;
  uint i;
  TArray<FName,_FName> *other_local;
  TArray<FName,_FName> *this_local;
  
  uVar1 = other->Count;
  this->Count = uVar1;
  this->Most = uVar1;
  if (this->Count == 0) {
    this->Array = (FName *)0x0;
  }
  else {
    pFVar2 = (FName *)M_Malloc_Dbg((ulong)this->Most << 2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/tarray.h"
                                   ,0x19e);
    this->Array = pFVar2;
    for (local_1c = 0; local_1c < this->Count; local_1c = local_1c + 1) {
      FName::FName(this->Array + local_1c,other->Array + local_1c);
    }
  }
  return;
}

Assistant:

void DoCopy (const TArray<T> &other)
	{
		Most = Count = other.Count;
		if (Count != 0)
		{
			Array = (T *)M_Malloc (sizeof(T)*Most);
			for (unsigned int i = 0; i < Count; ++i)
			{
				::new(&Array[i]) T(other.Array[i]);
			}
		}
		else
		{
			Array = NULL;
		}
	}